

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall cxxopts::OptionException::~OptionException(OptionException *this)

{
  *(undefined ***)this = &PTR__OptionException_00130590;
  std::__cxx11::string::~string((string *)&this->m_message);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

explicit OptionException(std::string  message)
    : m_message(std::move(message))
    {
    }